

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void prefixIterSetupTokendataCb(Fts5Index *p,void *pCtx,Fts5Iter *p1,u8 *pNew,int nNew)

{
  long lVar1;
  int iVar2;
  Fts5Buffer *in_RCX;
  int *in_RDX;
  long *in_RSI;
  u8 *in_RDI;
  u32 in_R8D;
  long in_FS_OFFSET;
  TokendataSetupCtx *pSetup;
  i64 iPos;
  int iPosOff;
  Fts5TokenDataIter *pT;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  pT = (Fts5TokenDataIter *)0x0;
  if (in_RCX != (Fts5Buffer *)0x0) {
    *(u32 *)((long)in_RSI + 0xc) = in_R8D - 1;
    *(undefined4 *)(in_RSI + 1) = *(undefined4 *)(*in_RSI + 0x18);
    sqlite3Fts5BufferAppendBlob(in_RDX,in_RCX,in_R8D,(u8 *)in_RSI);
  }
  while (iVar2 = sqlite3Fts5PoslistNext64(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,(i64 *)in_RCX),
        iVar2 == 0) {
    fts5TokendataIterAppendMap
              ((Fts5Index *)CONCAT44(uVar3,in_stack_fffffffffffffff0),pT,
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(i64)in_RSI,(i64)in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void prefixIterSetupTokendataCb(
  Fts5Index *p,
  void *pCtx,
  Fts5Iter *p1,
  const u8 *pNew,
  int nNew
){
  TokendataSetupCtx *pSetup = (TokendataSetupCtx*)pCtx;
  int iPosOff = 0;
  i64 iPos = 0;

  if( pNew ){
    pSetup->nTermByte = nNew-1;
    pSetup->iTermOff = pSetup->pT->terms.n;
    fts5BufferAppendBlob(&p->rc, &pSetup->pT->terms, nNew-1, pNew+1);
  }

  while( 0==sqlite3Fts5PoslistNext64(
     p1->base.pData, p1->base.nData, &iPosOff, &iPos
  ) ){
    fts5TokendataIterAppendMap(p,
        pSetup->pT, pSetup->iTermOff, pSetup->nTermByte, p1->base.iRowid, iPos
    );
  }
}